

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_tables.cpp
# Opt level: O0

void ImGui::TableHeadersRow(void)

{
  ImGuiTable *table_00;
  bool bVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  float row_min_height;
  ImVec2 IVar5;
  char *local_50;
  float fStack_3c;
  ImVec2 mouse_pos;
  char *name;
  int column_n;
  int columns_count;
  float row_height;
  float row_y1;
  ImGuiTable *table;
  ImGuiContext *g;
  
  table_00 = GImGui->CurrentTable;
  if (table_00 != (ImGuiTable *)0x0) {
    if ((table_00->IsLayoutLocked & 1U) == 0) {
      TableUpdateLayout(table_00);
    }
    IVar5 = GetCursorScreenPos();
    row_height = IVar5.y;
    row_min_height = TableGetHeaderRowHeight();
    TableNextRow(1,row_min_height);
    if ((table_00->HostSkipItems & 1U) == 0) {
      iVar2 = TableGetColumnCount();
      for (name._0_4_ = 0; (int)name < iVar2; name._0_4_ = (int)name + 1) {
        bVar1 = TableSetColumnIndex((int)name);
        if (bVar1) {
          uVar3 = TableGetColumnFlags((int)name);
          if ((uVar3 & 0x1000) == 0) {
            local_50 = TableGetColumnName((int)name);
          }
          else {
            local_50 = "";
          }
          PushID((int)table_00->InstanceCurrent * table_00->ColumnsCount + (int)name);
          TableHeader(local_50);
          PopID();
        }
      }
      IVar5 = GetMousePos();
      bVar1 = IsMouseReleased(1);
      if ((((bVar1) && (iVar4 = TableGetHoveredColumn(), iVar4 == iVar2)) &&
          (fStack_3c = IVar5.y, row_height <= fStack_3c)) &&
         (fStack_3c < row_height + row_min_height)) {
        TableOpenContextMenu(-1);
      }
    }
    return;
  }
  __assert_fail("table != __null && \"Need to call TableHeadersRow() after BeginTable()!\"",
                "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/cimgui/imgui/imgui_tables.cpp"
                ,0xb02,"void ImGui::TableHeadersRow()");
}

Assistant:

void ImGui::TableHeadersRow()
{
    ImGuiContext& g = *GImGui;
    ImGuiTable* table = g.CurrentTable;
    IM_ASSERT(table != NULL && "Need to call TableHeadersRow() after BeginTable()!");

    // Layout if not already done (this is automatically done by TableNextRow, we do it here solely to facilitate stepping in debugger as it is frequent to step in TableUpdateLayout)
    if (!table->IsLayoutLocked)
        TableUpdateLayout(table);

    // Open row
    const float row_y1 = GetCursorScreenPos().y;
    const float row_height = TableGetHeaderRowHeight();
    TableNextRow(ImGuiTableRowFlags_Headers, row_height);
    if (table->HostSkipItems) // Merely an optimization, you may skip in your own code.
        return;

    const int columns_count = TableGetColumnCount();
    for (int column_n = 0; column_n < columns_count; column_n++)
    {
        if (!TableSetColumnIndex(column_n))
            continue;

        // Push an id to allow unnamed labels (generally accidental, but let's behave nicely with them)
        // - in your own code you may omit the PushID/PopID all-together, provided you know they won't collide
        // - table->InstanceCurrent is only >0 when we use multiple BeginTable/EndTable calls with same identifier.
        const char* name = (TableGetColumnFlags(column_n) & ImGuiTableColumnFlags_NoHeaderLabel) ? "" : TableGetColumnName(column_n);
        PushID(table->InstanceCurrent * table->ColumnsCount + column_n);
        TableHeader(name);
        PopID();
    }

    // Allow opening popup from the right-most section after the last column.
    ImVec2 mouse_pos = ImGui::GetMousePos();
    if (IsMouseReleased(1) && TableGetHoveredColumn() == columns_count)
        if (mouse_pos.y >= row_y1 && mouse_pos.y < row_y1 + row_height)
            TableOpenContextMenu(-1); // Will open a non-column-specific popup.
}